

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addConstraintPair(Molecule *this,ConstraintPair *cp)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *in_RDI;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::begin
                     (in_RDI);
  __val = std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::end
                    (in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::ConstraintPair**,std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>,OpenMD::ConstraintPair*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::end
                    (in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::push_back
              ((vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
               __last._M_current,__val._M_current);
  }
  return;
}

Assistant:

void Molecule::addConstraintPair(ConstraintPair* cp) {
    if (std::find(constraintPairs_.begin(), constraintPairs_.end(), cp) ==
        constraintPairs_.end()) {
      constraintPairs_.push_back(cp);
    }
  }